

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.cpp
# Opt level: O0

void __thiscall glslang::TInfoSinkBase::append(TInfoSinkBase *this,TPersistString *t)

{
  FILE *__stream;
  size_t growth;
  undefined8 uVar1;
  TPersistString *t_local;
  TInfoSinkBase *this_local;
  
  if ((this->outputStream & 4U) != 0) {
    growth = std::__cxx11::string::size();
    checkMem(this,growth);
    std::__cxx11::string::append((string *)this);
  }
  __stream = _stdout;
  if ((this->outputStream & 2U) != 0) {
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s",uVar1);
  }
  return;
}

Assistant:

void TInfoSinkBase::append(const TPersistString& t)
{
    if (outputStream & EString) {
        checkMem(t.size());
        sink.append(t);
    }

//#ifdef _WIN32
//    if (outputStream & EDebugger)
//        OutputDebugString(t.c_str());
//#endif

    if (outputStream & EStdOut)
        fprintf(stdout, "%s", t.c_str());
}